

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

Var __thiscall
Js::TypedArray<short,_false,_false>::Subarray
          (TypedArray<short,_false,_false> *this,uint32 begin,uint32 end)

{
  int iVar1;
  ArrayBufferBase *pAVar2;
  ScriptContext *scriptContext;
  ThreadContext *this_00;
  code *pcVar3;
  anon_class_40_1_2f014396 implicitCall;
  bool bVar4;
  undefined4 *puVar5;
  JavascriptFunction *defaultConstructor;
  JavascriptFunction *instanceObj;
  Var aValue;
  RecyclableObject *pRVar6;
  undefined4 uStack_74;
  anon_class_40_5_98b124e0_for_newObjectCreationFunction local_68;
  uint32 local_3c;
  Type local_38;
  uint32 local_34;
  
  if (end < begin) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x53d,"(end >= begin)","end >= begin");
    if (!bVar4) goto LAB_00d8eac8;
    *puVar5 = 0;
  }
  pAVar2 = (this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr;
  scriptContext =
       (((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
           super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  local_38 = (this->super_TypedArrayBase).byteOffset;
  iVar1 = (this->super_TypedArrayBase).BYTES_PER_ELEMENT;
  local_3c = end - begin;
  defaultConstructor = TypedArrayBase::GetDefaultConstructor(this,scriptContext);
  instanceObj = (JavascriptFunction *)
                JavascriptOperators::SpeciesConstructor
                          ((RecyclableObject *)this,defaultConstructor,scriptContext);
  bVar4 = JavascriptOperators::IsConstructor((RecyclableObject *)instanceObj);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    local_34 = begin;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x548,"(JavascriptOperators::IsConstructor(constructor))",
                                "JavascriptOperators::IsConstructor(constructor)");
    if (!bVar4) {
LAB_00d8eac8:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
    begin = local_34;
  }
  local_68.beginByteOffset = iVar1 * begin + local_38;
  this_00 = scriptContext->threadContext;
  local_68.newLength = local_3c;
  local_68.constructor = (RecyclableObject *)instanceObj;
  local_68.buffer = pAVar2;
  local_68.scriptContext = scriptContext;
  if (instanceObj == defaultConstructor) {
    bVar4 = this_00->reentrancySafeOrHandled;
    this_00->reentrancySafeOrHandled = true;
    aValue = anon_func::anon_class_40_1_2f014396::
             anon_class_40_5_98b124e0_for_newObjectCreationFunction::operator()(&local_68);
    this_00->reentrancySafeOrHandled = bVar4;
  }
  else {
    implicitCall.newObjectCreationFunction._36_4_ = uStack_74;
    implicitCall.newObjectCreationFunction.newLength = local_3c;
    implicitCall.newObjectCreationFunction._20_4_ = local_68._20_4_;
    implicitCall.newObjectCreationFunction.beginByteOffset = local_68.beginByteOffset;
    implicitCall.newObjectCreationFunction.buffer = pAVar2;
    implicitCall.newObjectCreationFunction.constructor = (RecyclableObject *)instanceObj;
    implicitCall.newObjectCreationFunction.scriptContext = scriptContext;
    aValue = ThreadContext::
             ExecuteImplicitCall<Js::JavascriptOperators::NewObjectCreationHelper_ReentrancySafe<Js::TypedArray<short,false,false>::Subarray(unsigned_int,unsigned_int)::_lambda()_1_>(Js::RecyclableObject*,bool,ThreadContext*,Js::TypedArray<short,false,false>::Subarray(unsigned_int,unsigned_int)::_lambda()_1_)::_lambda()_1_>
                       (this_00,(RecyclableObject *)instanceObj,ImplicitCall_Accessor,implicitCall);
  }
  pRVar6 = VarTo<Js::RecyclableObject>(aValue);
  return pRVar6;
}

Assistant:

Var TypedArray<TypeName, clamped, virtualAllocated>::Subarray(uint32 begin, uint32 end)
    {
        Assert(end >= begin);

        Var newTypedArray;
        ScriptContext* scriptContext = this->GetScriptContext();
        ArrayBufferBase* buffer = this->GetArrayBuffer();
        uint32 srcByteOffset = this->GetByteOffset();
        uint32 beginByteOffset = srcByteOffset + begin * BYTES_PER_ELEMENT;
        uint32 newLength = end - begin;

        JavascriptFunction* defaultConstructor = TypedArrayBase::GetDefaultConstructor(this, scriptContext);
        RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(this, defaultConstructor, scriptContext);
        AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

        bool isDefaultConstructor = constructor == defaultConstructor;
        newTypedArray = VarTo<RecyclableObject>(JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
        {
            Js::Var constructorArgs[] = { constructor, buffer, JavascriptNumber::ToVar(beginByteOffset, scriptContext), JavascriptNumber::ToVar(newLength, scriptContext) };
            Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
            return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), newLength, scriptContext);
        }));

        return newTypedArray;
    }